

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpDeclarationSyntax::setChild
          (UdpDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00aeafe0 + *(int *)(&DAT_00aeafe0 + in_RSI * 4)))();
  return;
}

Assistant:

void UdpDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: primitive = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<UdpPortListSyntax>() : nullptr; return;
        case 4: body = child.node() ? &child.node()->as<UdpBodySyntax>() : nullptr; return;
        case 5: endprimitive = child.token(); return;
        case 6: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}